

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::FunctionalTest::ClearFramebuffers(FunctionalTest *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  GLfloat color_value [4];
  undefined8 local_28;
  undefined8 uStack_20;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  local_28 = 0;
  uStack_20 = 0;
  (**(code **)(lVar3 + 0x1f0))(this->m_fbo_1st,0x1800,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glClearNamedFramebufferfv has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1c98);
  (**(code **)(lVar3 + 0x1e8))(0,this->m_fbo_1st,0x84f9,0,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glClearNamedFramebufferfi has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1c9b);
  (**(code **)(lVar3 + 0x1f0))(this->m_fbo_1st,0x1800,0,&local_28);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glClearNamedFramebufferfv has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1c9f);
  return true;
}

Assistant:

bool FunctionalTest::ClearFramebuffers()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Failure of this part shall result in test failure (it is DSA functionality failure). */
	try
	{
		glw::GLfloat color_value[] = { 0.f, 0.f, 0.f, 0.f };
		glw::GLfloat depth_value   = 0.f;
		glw::GLint   stencil_value = 0;

		/* 1st framebuffer. */
		gl.clearNamedFramebufferfv(m_fbo_1st, GL_COLOR, 0, color_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glClearNamedFramebufferfv has failed");

		gl.clearNamedFramebufferfi(m_fbo_1st, GL_DEPTH_STENCIL, 0, depth_value, stencil_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glClearNamedFramebufferfi has failed");

		/* 2nd framebuffer. */
		gl.clearNamedFramebufferfv(m_fbo_1st, GL_COLOR, 0, color_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glClearNamedFramebufferfv has failed");
	}
	catch (...)
	{
		return false;
	}

	return true;
}